

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O3

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int iVar5;
  Mat *pMVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_30;
  
  pMVar6 = (Mat *)operator_new(0x60);
  local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_finish = pMVar6 + 2;
  pMVar6->data = (void *)0x0;
  pMVar6->refcount = (int *)0x0;
  pMVar6->elemsize = 0;
  pMVar6->dims = 0;
  pMVar6->w = 0;
  pMVar6->h = 0;
  pMVar6->c = 0;
  pMVar6->cstep = 0;
  pMVar6[1].data = (void *)0x0;
  pMVar6[1].refcount = (int *)0x0;
  pMVar6[1].elemsize = 0;
  pMVar6[1].dims = 0;
  pMVar6[1].w = 0;
  pMVar6[1].h = 0;
  pMVar6[1].c = 0;
  pMVar6[1].cstep = 0;
  local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start = pMVar6;
  local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pMVar6 != bottom_top_blob) {
    piVar1 = bottom_top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      piVar1 = pMVar6->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (pMVar6->data != (void *)0x0)) {
          free(*(void **)((long)pMVar6->data + -8));
        }
      }
    }
    pMVar6->refcount = (int *)0x0;
    piVar1 = bottom_top_blob->refcount;
    pMVar6->data = bottom_top_blob->data;
    pMVar6->refcount = piVar1;
    pMVar6->elemsize = bottom_top_blob->elemsize;
    iVar5 = bottom_top_blob->w;
    iVar2 = bottom_top_blob->h;
    iVar3 = bottom_top_blob->c;
    pMVar6->dims = bottom_top_blob->dims;
    pMVar6->w = iVar5;
    pMVar6->h = iVar2;
    pMVar6->c = iVar3;
    pMVar6->cstep = bottom_top_blob->cstep;
  }
  pMVar4 = local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar6 = local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  if (pMVar6 != &this->scale_data) {
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = local_30.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (pMVar6->data != (void *)0x0)) {
        free(*(void **)((long)pMVar6->data + -8));
      }
    }
    pMVar4[1].h = 0;
    pMVar4[1].c = 0;
    pMVar4[1].cstep = 0;
    pMVar4[1].elemsize = 0;
    pMVar4[1].dims = 0;
    pMVar4[1].w = 0;
    pMVar6->data = (void *)0x0;
    pMVar4[1].refcount = (int *)0x0;
    piVar1 = (this->scale_data).refcount;
    pMVar4[1].data = (this->scale_data).data;
    pMVar4[1].refcount = piVar1;
    pMVar4[1].elemsize = (this->scale_data).elemsize;
    iVar5 = (this->scale_data).w;
    iVar2 = (this->scale_data).h;
    iVar3 = (this->scale_data).c;
    pMVar4[1].dims = (this->scale_data).dims;
    pMVar4[1].w = iVar5;
    pMVar4[1].h = iVar2;
    pMVar4[1].c = iVar3;
    pMVar4[1].cstep = (this->scale_data).cstep;
  }
  iVar5 = (*(this->super_Layer)._vptr_Layer[6])(this,&local_30);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_30);
  return iVar5;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs);
}